

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

size_t cs_disasm(csh ud,uint8_t *buffer,size_t size,uint64_t offset,size_t count,cs_insn **insn)

{
  cs_skipdata_cb_t p_Var1;
  cs_struct *pcVar2;
  _Bool _Var3;
  cs_insn *pcVar4;
  cs_detail *pcVar5;
  size_t __n;
  cs_insn *pcVar6;
  cs_insn *pcVar7;
  size_t sVar8;
  int iVar9;
  uint8_t *buffer_00;
  cs_detail **ppcVar10;
  uint64_t uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  uint16_t insn_size;
  MCInst mci;
  SStream ss;
  uint16_t local_5d6;
  int local_5d4;
  cs_insn *local_5d0;
  size_t local_5c8;
  cs_insn **local_5c0;
  cs_struct *local_5b8;
  size_t local_5b0;
  size_t local_5a8;
  size_t local_5a0;
  uint8_t *local_598;
  uint64_t local_590;
  size_t local_588;
  size_t local_580;
  long local_578;
  ulong local_570;
  MCInst local_568;
  SStream local_234;
  
  if (ud == 0) {
    return 0;
  }
  *(undefined4 *)(ud + 0x58) = 0;
  uVar14 = 0x20;
  if (count - 1 < 0x20) {
    uVar14 = count & 0xffffffff;
  }
  local_5a0 = size;
  local_598 = buffer;
  local_590 = offset;
  pcVar4 = (cs_insn *)(*cs_mem_malloc)(uVar14 * 0xf0);
  if (pcVar4 == (cs_insn *)0x0) {
LAB_00144d67:
    ((cs_struct *)ud)->errnum = CS_ERR_MEM;
    return 0;
  }
  if (local_5a0 != 0) {
    sVar8 = 0;
    sVar15 = 1;
    lVar12 = 0xf0;
    local_5c8 = local_5a0;
    iVar9 = 0;
    buffer_00 = local_598;
    uVar11 = local_590;
    local_5d0 = pcVar4;
    local_5c0 = insn;
    local_5b8 = (cs_struct *)ud;
    local_5b0 = uVar14 * 0xf0;
    local_580 = count;
    do {
      ud = (csh)local_5b8;
      local_5d4 = iVar9;
      local_5a8 = sVar8;
      local_578 = lVar12;
      MCInst_Init(&local_568);
      local_570 = uVar14;
      local_568.address = uVar11;
      local_568.csh = (cs_struct *)ud;
      if (((cs_struct *)ud)->detail == CS_OPT_OFF) {
        pcVar5 = (cs_detail *)0x0;
      }
      else {
        pcVar5 = (cs_detail *)(*cs_mem_malloc)(0x5f8);
      }
      pcVar4->detail = pcVar5;
      pcVar4->address = uVar11;
      local_568.flat_insn = pcVar4;
      _Var3 = (*((cs_struct *)ud)->disasm)
                        (ud,buffer_00,local_5c8,&local_568,&local_5d6,uVar11,
                         ((cs_struct *)ud)->getinsn_info);
      if (_Var3) {
        SStream_Init(&local_234);
        (local_568.flat_insn)->size = local_5d6;
        (*((cs_struct *)ud)->insn_id)((cs_struct *)ud,pcVar4,local_568.Opcode);
        (*((cs_struct *)ud)->printer)(&local_568,&local_234,((cs_struct *)ud)->printer_info);
        fill_insn((cs_struct *)ud,pcVar4,local_234.buffer,&local_568,((cs_struct *)ud)->post_printer
                  ,buffer_00);
        __n = (size_t)local_5d6;
        uVar14 = local_570;
        sVar16 = sVar15;
      }
      else {
        if (((cs_struct *)ud)->detail != CS_OPT_OFF) {
          (*cs_mem_free)(pcVar4->detail);
        }
        uVar14 = local_570;
        sVar16 = local_5a8;
        iVar9 = local_5d4;
        if (((cs_struct *)ud)->skipdata != true) break;
        __n = (size_t)((cs_struct *)ud)->skipdata_size;
        local_588 = sVar15;
        if (local_5c8 < __n) {
          sVar16 = sVar15 - 1;
          break;
        }
        p_Var1 = (((cs_struct *)ud)->skipdata_setup).callback;
        if ((p_Var1 != (cs_skipdata_cb_t)0x0) &&
           (__n = (*p_Var1)(local_598,local_5a0,uVar11 - local_590,
                            (((cs_struct *)ud)->skipdata_setup).user_data), sVar16 = local_5a8,
           iVar9 = local_5d4, local_5c8 <= __n - 1)) break;
        pcVar4->id = 0;
        pcVar4->address = uVar11;
        pcVar4->size = (uint16_t)__n;
        memcpy(pcVar4->bytes,buffer_00,__n);
        strncpy(pcVar4->mnemonic,(((cs_struct *)ud)->skipdata_setup).mnemonic,0x1f);
        skipdata_opstr(pcVar4->op_str,buffer_00,__n);
        pcVar4->detail = (cs_detail *)0x0;
        sVar16 = local_588;
      }
      pcVar7 = local_5d0;
      iVar9 = local_5d4 + 1;
      sVar8 = local_580;
      ud = (csh)local_5b8;
      if (local_580 != 0 && local_580 == sVar16) goto LAB_00144cf9;
      if (iVar9 == (int)uVar14) {
        uVar14 = (ulong)(uint)((int)uVar14 << 3) / 5;
        local_5b0 = local_5b0 + uVar14 * 0xf0;
        pcVar6 = (cs_insn *)(*cs_mem_realloc)(local_5d0,local_5b0);
        pcVar2 = local_5b8;
        if (pcVar6 == (cs_insn *)0x0) {
          if (sVar16 != 0 && local_5b8->detail != CS_OPT_OFF) {
            ppcVar10 = &pcVar7->detail;
            do {
              (*cs_mem_free)(*ppcVar10);
              ppcVar10 = ppcVar10 + 0x1e;
              sVar16 = sVar16 - 1;
            } while (sVar16 != 0);
          }
          (*cs_mem_free)(pcVar7);
          *local_5c0 = (cs_insn *)0x0;
          pcVar2->errnum = CS_ERR_MEM;
          return 0;
        }
        pcVar4 = (cs_insn *)(pcVar6->bytes + local_578 + -0x12);
        iVar9 = 0;
        local_5d0 = pcVar6;
      }
      else {
        pcVar4 = pcVar4 + 1;
      }
      buffer_00 = buffer_00 + __n;
      uVar11 = uVar11 + __n;
      sVar15 = sVar16 + 1;
      lVar12 = local_578 + 0xf0;
      sVar8 = local_5a8 + 1;
      local_5c8 = local_5c8 - __n;
      ud = (csh)local_5b8;
    } while (local_5c8 != 0);
    sVar8 = sVar16;
    pcVar4 = local_5d0;
    insn = local_5c0;
    if (sVar16 != 0) {
LAB_00144cf9:
      insn = local_5c0;
      pcVar4 = local_5d0;
      uVar13 = (int)uVar14 - iVar9;
      pcVar7 = local_5d0;
      if ((uVar13 != 0) &&
         (pcVar7 = (cs_insn *)(*cs_mem_realloc)(local_5d0,(ulong)uVar13 * -0xf0 + local_5b0),
         pcVar7 == (cs_insn *)0x0)) {
        if (((cs_struct *)ud)->detail != CS_OPT_OFF) {
          ppcVar10 = &pcVar4->detail;
          do {
            (*cs_mem_free)(*ppcVar10);
            ppcVar10 = ppcVar10 + 0x1e;
            sVar8 = sVar8 - 1;
          } while (sVar8 != 0);
        }
        (*cs_mem_free)(pcVar4);
        *insn = (cs_insn *)0x0;
        goto LAB_00144d67;
      }
      goto LAB_00144d2b;
    }
  }
  (*cs_mem_free)(pcVar4);
  sVar8 = 0;
  pcVar7 = (cs_insn *)0x0;
LAB_00144d2b:
  *insn = pcVar7;
  return sVar8;
}

Assistant:

CAPSTONE_EXPORT
size_t cs_disasm(csh ud, const uint8_t *buffer, size_t size, uint64_t offset, size_t count, cs_insn **insn)
{
	struct cs_struct *handle;
	MCInst mci;
	uint16_t insn_size;
	size_t c = 0, i;
	unsigned int f = 0;	// index of the next instruction in the cache
	cs_insn *insn_cache;	// cache contains disassembled instructions
	void *total = NULL;
	size_t total_size = 0;	// total size of output buffer containing all insns
	bool r;
	void *tmp;
	size_t skipdata_bytes;
	uint64_t offset_org; // save all the original info of the buffer
	size_t size_org;
	const uint8_t *buffer_org;
	unsigned int cache_size = INSN_CACHE_SIZE;
	size_t next_offset;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		// FIXME: how to handle this case:
		// handle->errnum = CS_ERR_HANDLE;
		return 0;
	}

	handle->errnum = CS_ERR_OK;

#ifdef CAPSTONE_USE_SYS_DYN_MEM
	if (count > 0 && count <= INSN_CACHE_SIZE)
		cache_size = (unsigned int) count;
#endif

	// save the original offset for SKIPDATA
	buffer_org = buffer;
	offset_org = offset;
	size_org = size;

	total_size = sizeof(cs_insn) * cache_size;
	total = cs_mem_malloc(total_size);
	if (total == NULL) {
		// insufficient memory
		handle->errnum = CS_ERR_MEM;
		return 0;
	}

	insn_cache = total;

	while (size > 0) {
		MCInst_Init(&mci);
		mci.csh = handle;

		// relative branches need to know the address & size of current insn
		mci.address = offset;

		if (handle->detail) {
			// allocate memory for @detail pointer
			insn_cache->detail = cs_mem_malloc(sizeof(cs_detail));
		} else {
			insn_cache->detail = NULL;
		}

		// save all the information for non-detailed mode
		mci.flat_insn = insn_cache;
		mci.flat_insn->address = offset;
#ifdef CAPSTONE_DIET
		// zero out mnemonic & op_str
		mci.flat_insn->mnemonic[0] = '\0';
		mci.flat_insn->op_str[0] = '\0';
#endif

		r = handle->disasm(ud, buffer, size, &mci, &insn_size, offset, handle->getinsn_info);
		if (r) {
			SStream ss;
			SStream_Init(&ss);

			mci.flat_insn->size = insn_size;

			// map internal instruction opcode to public insn ID
			handle->insn_id(handle, insn_cache, mci.Opcode);

			handle->printer(&mci, &ss, handle->printer_info);

			fill_insn(handle, insn_cache, ss.buffer, &mci, handle->post_printer, buffer);

			next_offset = insn_size;
		} else	{
			// encounter a broken instruction

			// free memory of @detail pointer
			if (handle->detail) {
				cs_mem_free(insn_cache->detail);
			}

			// if there is no request to skip data, or remaining data is too small,
			// then bail out
			if (!handle->skipdata || handle->skipdata_size > size)
				break;

			if (handle->skipdata_setup.callback) {
				skipdata_bytes = handle->skipdata_setup.callback(buffer_org, size_org,
						(size_t)(offset - offset_org), handle->skipdata_setup.user_data);
				if (skipdata_bytes > size)
					// remaining data is not enough
					break;

				if (!skipdata_bytes)
					// user requested not to skip data, so bail out
					break;
			} else
				skipdata_bytes = handle->skipdata_size;

			// we have to skip some amount of data, depending on arch & mode
			insn_cache->id = 0;	// invalid ID for this "data" instruction
			insn_cache->address = offset;
			insn_cache->size = (uint16_t)skipdata_bytes;
			memcpy(insn_cache->bytes, buffer, skipdata_bytes);
			strncpy(insn_cache->mnemonic, handle->skipdata_setup.mnemonic,
					sizeof(insn_cache->mnemonic) - 1);
			skipdata_opstr(insn_cache->op_str, buffer, skipdata_bytes);
			insn_cache->detail = NULL;

			next_offset = skipdata_bytes;
		}

		// one more instruction entering the cache
		f++;

		// one more instruction disassembled
		c++;
		if (count > 0 && c == count)
			// already got requested number of instructions
			break;

		if (f == cache_size) {
			// full cache, so expand the cache to contain incoming insns
			cache_size = cache_size * 8 / 5; // * 1.6 ~ golden ratio
			total_size += (sizeof(cs_insn) * cache_size);
			tmp = cs_mem_realloc(total, total_size);
			if (tmp == NULL) {	// insufficient memory
				if (handle->detail) {
					insn_cache = (cs_insn *)total;
					for (i = 0; i < c; i++, insn_cache++)
						cs_mem_free(insn_cache->detail);
				}

				cs_mem_free(total);
				*insn = NULL;
				handle->errnum = CS_ERR_MEM;
				return 0;
			}

			total = tmp;
			// continue to fill in the cache after the last instruction
			insn_cache = (cs_insn *)((char *)total + sizeof(cs_insn) * c);

			// reset f back to 0, so we fill in the cache from begining
			f = 0;
		} else
			insn_cache++;

		buffer += next_offset;
		size -= next_offset;
		offset += next_offset;
	}

	if (!c) {
		// we did not disassemble any instruction
		cs_mem_free(total);
		total = NULL;
	} else if (f != cache_size) {
		// total did not fully use the last cache, so downsize it
		void *tmp = cs_mem_realloc(total, total_size - (cache_size - f) * sizeof(*insn_cache));
		if (tmp == NULL) {	// insufficient memory
			// free all detail pointers
			if (handle->detail) {
				insn_cache = (cs_insn *)total;
				for (i = 0; i < c; i++, insn_cache++)
					cs_mem_free(insn_cache->detail);
			}

			cs_mem_free(total);
			*insn = NULL;

			handle->errnum = CS_ERR_MEM;
			return 0;
		}

		total = tmp;
	}

	*insn = total;

	return c;
}